

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

void pbrt::createCamera(SP *scene,SP *pbrt)

{
  undefined8 uVar1;
  bool bVar2;
  ostream *this;
  element_type *peVar3;
  runtime_error *this_00;
  element_type *peVar4;
  float fVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  vec3f vVar6;
  float fovDistanceToUnitPlane;
  affine3f frame;
  float focalDistance;
  float lensRadius;
  float fov;
  shared_ptr<pbrt::syntactic::Camera> camera;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
  *__range1;
  SP ours;
  vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
  *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  float in_stack_fffffffffffffda4;
  undefined1 in_stack_fffffffffffffda8 [16];
  undefined4 in_stack_fffffffffffffe10;
  float in_stack_fffffffffffffe14;
  SP *in_stack_fffffffffffffe48;
  undefined8 local_84;
  float local_7c;
  __shared_ptr local_58 [16];
  shared_ptr<pbrt::syntactic::Camera> *local_48;
  __normal_iterator<std::shared_ptr<pbrt::syntactic::Camera>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>_>
  local_40;
  vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
  *local_38;
  undefined4 local_30;
  vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
  local_20;
  
  std::make_shared<pbrt::Camera>();
  std::__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1af331);
  bVar2 = std::
          vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
          ::empty(in_stack_fffffffffffffda8._8_8_);
  if (bVar2) {
    this = std::operator<<((ostream *)&std::cout,"warning: no \'camera\'(s) in pbrt file");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_30 = 1;
  }
  else {
    peVar3 = std::
             __shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1af3ac);
    local_38 = &peVar3->cameras;
    local_40._M_current =
         (shared_ptr<pbrt::syntactic::Camera> *)
         std::
         vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
         ::begin(in_stack_fffffffffffffd98);
    local_48 = (shared_ptr<pbrt::syntactic::Camera> *)
               std::
               vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
               ::end(in_stack_fffffffffffffd98);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<pbrt::syntactic::Camera>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                         (__normal_iterator<std::shared_ptr<pbrt::syntactic::Camera>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>_>
                          *)in_stack_fffffffffffffd98);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<pbrt::syntactic::Camera>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>_>
      ::operator*(&local_40);
      std::shared_ptr<pbrt::syntactic::Camera>::shared_ptr
                ((shared_ptr<pbrt::syntactic::Camera> *)
                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (shared_ptr<pbrt::syntactic::Camera> *)in_stack_fffffffffffffd98);
      bVar2 = std::__shared_ptr::operator_cast_to_bool(local_58);
      if (!bVar2) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"invalid pbrt camera");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::shared_ptr<pbrt::syntactic::Camera>::shared_ptr
                ((shared_ptr<pbrt::syntactic::Camera> *)
                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (shared_ptr<pbrt::syntactic::Camera> *)in_stack_fffffffffffffd98);
      fVar5 = findCameraFov(in_stack_fffffffffffffe48);
      std::shared_ptr<pbrt::syntactic::Camera>::~shared_ptr
                ((shared_ptr<pbrt::syntactic::Camera> *)0x1af4f9);
      std::__shared_ptr_access<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1af52e);
      math::inverse((affine3f *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      peVar4 = std::__shared_ptr_access<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1af551);
      (peVar4->simplified).lens_center.z = local_7c;
      (peVar4->simplified).lens_center.x = (float)(undefined4)local_84;
      (peVar4->simplified).lens_center.y = (float)local_84._4_4_;
      vVar6 = math::operator*(in_stack_fffffffffffffda8._0_4_,
                              (vec3f *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)
                             );
      peVar4 = std::__shared_ptr_access<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1af5db);
      (peVar4->simplified).lens_du.z = vVar6.z;
      (peVar4->simplified).lens_du.x = (float)(int)vVar6._0_8_;
      (peVar4->simplified).lens_du.y = (float)(int)((ulong)vVar6._0_8_ >> 0x20);
      vVar6 = math::operator*(in_stack_fffffffffffffda8._0_4_,
                              (vec3f *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)
                             );
      peVar4 = std::__shared_ptr_access<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1af668);
      (peVar4->simplified).lens_dv.z = vVar6.z;
      (peVar4->simplified).lens_dv.x = (float)(int)vVar6._0_8_;
      (peVar4->simplified).lens_dv.y = (float)(int)((ulong)vVar6._0_8_ >> 0x20);
      tanf(fVar5 * 0.5 * 0.017453292);
      vVar6 = math::operator*(in_stack_fffffffffffffda8._0_4_,
                              (vec3f *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)
                             );
      in_stack_fffffffffffffe14 = vVar6.z;
      vVar6 = math::operator+(in_stack_fffffffffffffda8._8_8_,in_stack_fffffffffffffda8._0_8_);
      fVar5 = in_stack_fffffffffffffda8._0_4_;
      peVar4 = std::__shared_ptr_access<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1af79d);
      (peVar4->simplified).screen_center.z = vVar6.z;
      (peVar4->simplified).screen_center.x = (float)(int)vVar6._0_8_;
      (peVar4->simplified).screen_center.y = (float)(int)((ulong)vVar6._0_8_ >> 0x20);
      vVar6 = math::operator*(fVar5,(vec3f *)CONCAT44(in_stack_fffffffffffffda4,
                                                      in_stack_fffffffffffffda0));
      peVar4 = std::__shared_ptr_access<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1af82a);
      (peVar4->simplified).screen_du.z = vVar6.z;
      (peVar4->simplified).screen_du.x = (float)(int)vVar6._0_8_;
      (peVar4->simplified).screen_du.y = (float)(int)((ulong)vVar6._0_8_ >> 0x20);
      vVar6 = math::operator*(fVar5,(vec3f *)CONCAT44(in_stack_fffffffffffffda4,
                                                      in_stack_fffffffffffffda0));
      uVar1 = vVar6._0_8_;
      in_stack_fffffffffffffda8._8_4_ = extraout_XMM0_Dc;
      in_stack_fffffffffffffda8._0_8_ = uVar1;
      in_stack_fffffffffffffda8._12_4_ = extraout_XMM0_Dd;
      in_stack_fffffffffffffd98 = &local_20;
      in_stack_fffffffffffffda4 = vVar6.z;
      peVar4 = std::__shared_ptr_access<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1af8bb);
      (peVar4->simplified).screen_dv.z = vVar6.z;
      (peVar4->simplified).screen_dv.x = (float)(int)uVar1;
      (peVar4->simplified).screen_dv.y = (float)(int)((ulong)uVar1 >> 0x20);
      std::__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1af8de);
      std::vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>::
      push_back(in_stack_fffffffffffffda8._8_8_,in_stack_fffffffffffffda8._0_8_);
      std::shared_ptr<pbrt::syntactic::Camera>::~shared_ptr
                ((shared_ptr<pbrt::syntactic::Camera> *)0x1af8fd);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<pbrt::syntactic::Camera>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>_>
      ::operator++(&local_40);
    }
    local_30 = 0;
  }
  std::shared_ptr<pbrt::Camera>::~shared_ptr((shared_ptr<pbrt::Camera> *)0x1af957);
  return;
}

Assistant:

void createCamera(Scene::SP scene, pbrt::syntactic::Scene::SP pbrt)
  {
    Camera::SP ours = std::make_shared<Camera>();
    if (pbrt->cameras.empty()) {
      std::cout << "warning: no 'camera'(s) in pbrt file" << std::endl;
      return;
    }

    for (auto camera : pbrt->cameras) {
      if (!camera)
        throw std::runtime_error("invalid pbrt camera");

      const float fov = findCameraFov(camera);

      // TODO: lensradius and focaldistance:

      //     float 	lensradius 	0 	The radius of the lens. Used to render scenes with depth of field and focus effects. The default value yields a pinhole camera.
      const float lensRadius = 0.f;

      // float 	focaldistance 	10^30 	The focal distance of the lens. If "lensradius" is zero, this has no effect. Otherwise, it specifies the distance from the camera origin to the focal plane.
      const float focalDistance = 1.f;
    
      const affine3f frame = inverse(camera->transform.atStart);
    
      ours->simplified.lens_center = frame.p;
      ours->simplified.lens_du = lensRadius * frame.l.vx;
      ours->simplified.lens_dv = lensRadius * frame.l.vy;

      const float fovDistanceToUnitPlane = 0.5f / tanf(fov/2 * float(M_PI/180.f));
      ours->simplified.screen_center = frame.p + focalDistance * frame.l.vz;
      ours->simplified.screen_du = - focalDistance/fovDistanceToUnitPlane * frame.l.vx;
      ours->simplified.screen_dv = focalDistance/fovDistanceToUnitPlane * frame.l.vy;

      scene->cameras.push_back(ours);
    }
  }